

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::ConditionalStatementSyntax::ConditionalStatementSyntax
          (ConditionalStatementSyntax *this,NamedLabelSyntax *label,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token uniqueOrPriority,
          Token ifKeyword,Token openParen,ConditionalPredicateSyntax *predicate,Token closeParen,
          StatementSyntax *statement,ElseClauseSyntax *elseClause)

{
  ConditionalPredicateSyntax *pCVar1;
  StatementSyntax *pSVar2;
  undefined8 uVar3;
  StatementSyntax *local_38;
  
  uVar3 = uniqueOrPriority._0_8_;
  StatementSyntax::StatementSyntax
            (&this->super_StatementSyntax,ConditionalStatement,label,attributes);
  (this->uniqueOrPriority).kind = (short)uVar3;
  (this->uniqueOrPriority).field_0x2 = (char)((ulong)uVar3 >> 0x10);
  (this->uniqueOrPriority).numFlags = (NumericTokenFlags)(char)((ulong)uVar3 >> 0x18);
  (this->uniqueOrPriority).rawLen = (int)((ulong)uVar3 >> 0x20);
  (this->uniqueOrPriority).info = uniqueOrPriority.info;
  (this->ifKeyword).kind = ifKeyword.kind;
  (this->ifKeyword).field_0x2 = ifKeyword._2_1_;
  (this->ifKeyword).numFlags = (NumericTokenFlags)ifKeyword.numFlags.raw;
  (this->ifKeyword).rawLen = ifKeyword.rawLen;
  (this->ifKeyword).info = ifKeyword.info;
  (this->openParen).kind = openParen.kind;
  (this->openParen).field_0x2 = openParen._2_1_;
  (this->openParen).numFlags = (NumericTokenFlags)openParen.numFlags.raw;
  (this->openParen).rawLen = openParen.rawLen;
  (this->openParen).info = openParen.info;
  local_38 = (StatementSyntax *)predicate;
  not_null<slang::syntax::ConditionalPredicateSyntax*>::
  not_null<slang::syntax::ConditionalPredicateSyntax*,void>
            ((not_null<slang::syntax::ConditionalPredicateSyntax*> *)&this->predicate,
             (ConditionalPredicateSyntax **)&local_38);
  (this->closeParen).kind = closeParen.kind;
  (this->closeParen).field_0x2 = closeParen._2_1_;
  (this->closeParen).numFlags = (NumericTokenFlags)closeParen.numFlags.raw;
  (this->closeParen).rawLen = closeParen.rawLen;
  (this->closeParen).info = closeParen.info;
  local_38 = statement;
  not_null<slang::syntax::StatementSyntax*>::not_null<slang::syntax::StatementSyntax*,void>
            ((not_null<slang::syntax::StatementSyntax*> *)&this->statement,&local_38);
  this->elseClause = elseClause;
  pCVar1 = not_null<slang::syntax::ConditionalPredicateSyntax_*>::get(&this->predicate);
  (pCVar1->super_SyntaxNode).parent = (SyntaxNode *)this;
  pSVar2 = not_null<slang::syntax::StatementSyntax_*>::get(&this->statement);
  (pSVar2->super_SyntaxNode).parent = (SyntaxNode *)this;
  if (this->elseClause != (ElseClauseSyntax *)0x0) {
    (this->elseClause->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

ConditionalStatementSyntax(NamedLabelSyntax* label, const SyntaxList<AttributeInstanceSyntax>& attributes, Token uniqueOrPriority, Token ifKeyword, Token openParen, ConditionalPredicateSyntax& predicate, Token closeParen, StatementSyntax& statement, ElseClauseSyntax* elseClause) :
        StatementSyntax(SyntaxKind::ConditionalStatement, label, attributes), uniqueOrPriority(uniqueOrPriority), ifKeyword(ifKeyword), openParen(openParen), predicate(&predicate), closeParen(closeParen), statement(&statement), elseClause(elseClause) {
        this->predicate->parent = this;
        this->statement->parent = this;
        if (this->elseClause) this->elseClause->parent = this;
    }